

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx2.cpp
# Opt level: O0

void ncnn::transpose_pack_A_tile_int8_avx2(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  int in_stack_00000068;
  int in_stack_0000006c;
  int in_stack_00000070;
  int in_stack_00000074;
  Mat *in_stack_00000078;
  Mat *in_stack_00000080;
  
  transpose_pack_A_tile_int8
            (in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000070,
             in_stack_0000006c,in_stack_00000068);
  return;
}

Assistant:

void transpose_pack_A_tile_int8_avx2(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    transpose_pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}